

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<std::map<std::string,_vector<Resource,_allocator<Resource>_>_>,_cmCTestResourceSpec::ReadFileResult>
* __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::
MapFilter<std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::function<cmCTestResourceSpec::ReadFileResult(std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>&,Json::Value_const*)>,(anonymous_namespace)::__0>
          (cmJSONHelper<std::map<std::string,_vector<Resource,_allocator<Resource>_>_>,_cmCTestResourceSpec::ReadFileResult>
           *__return_storage_ptr__,ReadFileResult param_2,ReadFileResult success,
          function<cmCTestResourceSpec::ReadFileResult_(std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_&,_const_Json::Value_*)>
          *param_4)

{
  anon_class_48_4_71e8aacc local_58;
  function<cmCTestResourceSpec::ReadFileResult_(std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_&,_const_Json::Value_*)>
  *local_28;
  function<cmCTestResourceSpec::ReadFileResult_(std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_&,_const_Json::Value_*)>
  *func_local;
  ReadFileResult local_18;
  ReadFileResult fail_local;
  ReadFileResult success_local;
  
  local_58.success = param_2;
  local_58.fail = success;
  local_28 = param_4;
  func_local._4_4_ = success;
  local_18 = param_2;
  _success_local = __return_storage_ptr__;
  std::
  function<cmCTestResourceSpec::ReadFileResult_(std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_&,_const_Json::Value_*)>
  ::function(&local_58.func,param_4);
  std::
  function<cmCTestResourceSpec::ReadFileResult(std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::MapFilter<std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::function<cmCTestResourceSpec::ReadFileResult(std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>&,Json::Value_const*)>,(anonymous_namespace)::__0>(cmCTestResourceSpec::ReadFileResult,cmCTestResourceSpec::ReadFileResult,std::function<cmCTestResourceSpec::ReadFileResult(std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>&,Json::Value_const*)>,(anonymous_namespace)::__0)::_lambda(std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>&,Json::Value_const*)_1_,void>
            ((function<cmCTestResourceSpec::ReadFileResult(std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>&,Json::Value_const*)>
              *)__return_storage_ptr__,&local_58);
  MapFilter<std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::function<cmCTestResourceSpec::ReadFileResult(std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>&,Json::Value_const*)>,(anonymous_namespace)::$_0>(cmCTestResourceSpec::ReadFileResult,cmCTestResourceSpec::ReadFileResult,std::function<cmCTestResourceSpec::ReadFileResult(std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>&,Json::Value_const*)>,(anonymous_namespace)::$_0)
  ::
  {lambda(std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>&,Json::Value_const*)#1}
  ::~MapFilter((_lambda_std__map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>__Json__Value_const___1_
                *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::map<std::string, T>, E, CallState...> MapFilter(
    E success, E fail, F func, Filter filter)
  {
    return [success, fail, func, filter](std::map<std::string, T>& out,
                                         const Json::Value* value,
                                         CallState&&... state) -> E {
      if (!value) {
        out.clear();
        return success;
      }
      if (!value->isObject()) {
        return fail;
      }
      out.clear();
      for (auto const& key : value->getMemberNames()) {
        if (!filter(key)) {
          continue;
        }
        T t;
        E result = func(t, &(*value)[key], std::forward(state)...);
        if (result != success) {
          return result;
        }
        out[key] = std::move(t);
      }
      return success;
    };
  }